

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printSummaryDivider(ConsoleReporter *this)

{
  ostream *poVar1;
  
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam0000000000146640 = 0x2d2d2d2d2d2d2d;
    uRam0000000000146647 = 0x2d2d2d2d2d2d2d2d;
    _DAT_00146630 = 0x2d2d2d2d2d2d2d2d;
    uRam0000000000146638 = 0x2d2d2d2d2d2d2d;
    DAT_0014663f = 0x2d;
    _DAT_00146620 = 0x2d2d2d2d2d2d2d2d;
    uRam0000000000146628 = 0x2d2d2d2d2d2d2d2d;
    _DAT_00146610 = 0x2d2d2d2d2d2d2d2d;
    uRam0000000000146618 = 0x2d2d2d2d2d2d2d2d;
    _line = 0x2d2d2d2d2d2d2d2d;
    uRam0000000000146608 = 0x2d2d2d2d2d2d2d2d;
    DAT_0014664f = 0;
  }
  poVar1 = std::operator<<((this->super_StreamingReporterBase).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar1,"\n");
  return;
}

Assistant:

void printSummaryDivider() {
            stream << getLineOfChars<'-'>() << "\n";
        }